

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O2

int pmbtoken_issuer_key_from_bytes
              (PMBTOKEN_METHOD *method,TRUST_TOKEN_ISSUER_KEY *key,uint8_t *in,size_t len)

{
  EC_PRECOMP *p0;
  EC_GROUP *group;
  uint uVar1;
  int iVar2;
  BIGNUM *bn;
  size_t i;
  long lVar3;
  EC_PRECOMP *p1;
  CBS tmp;
  EC_SCALAR *scalars [6];
  CBS cbs;
  EC_AFFINE pub_affine [3];
  EC_JACOBIAN pub [3];
  
  group = method->group;
  cbs.data = in;
  cbs.len = len;
  bn = EC_GROUP_get0_order(group);
  uVar1 = BN_num_bytes(bn);
  lVar3 = 0;
  scalars[0] = &key->x0;
  scalars[1] = &key->y0;
  scalars[2] = &key->x1;
  scalars[3] = &key->y1;
  scalars[4] = &key->xs;
  scalars[5] = &key->ys;
  do {
    if (lVar3 == 6) {
      p0 = &method->g_precomp;
      p1 = &method->h_precomp;
      iVar2 = ec_point_mul_scalar_precomp
                        (group,pub,p0,&key->x0,p1,&key->y0,(EC_PRECOMP *)0x0,(EC_SCALAR *)0x0);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = ec_init_precomp(group,&key->pub0_precomp,pub);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = ec_point_mul_scalar_precomp
                        (group,pub + 1,p0,&key->x1,p1,&key->y1,(EC_PRECOMP *)0x0,(EC_SCALAR *)0x0);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = ec_init_precomp(group,&key->pub1_precomp,pub + 1);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = ec_point_mul_scalar_precomp
                        (group,pub + 2,p0,&key->xs,p1,&key->ys,(EC_PRECOMP *)0x0,(EC_SCALAR *)0x0);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = ec_init_precomp(group,&key->pubs_precomp,pub + 2);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = ec_jacobian_to_affine_batch(group,pub_affine,pub,3);
      if (iVar2 == 0) {
        return 0;
      }
      memcpy(&key->pub0,pub_affine,0x90);
      memcpy(&key->pub1,pub_affine + 1,0x90);
      memcpy(&key->pubs,pub_affine + 2,0x90);
      return 1;
    }
    iVar2 = CBS_get_bytes(&cbs,&tmp,(ulong)uVar1);
    if (iVar2 == 0) break;
    iVar2 = ec_scalar_from_bytes(group,scalars[lVar3],tmp.data,tmp.len);
    lVar3 = lVar3 + 1;
  } while (iVar2 != 0);
  ERR_put_error(0x20,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                ,0x126);
  return 0;
}

Assistant:

static int pmbtoken_issuer_key_from_bytes(const PMBTOKEN_METHOD *method,
                                          TRUST_TOKEN_ISSUER_KEY *key,
                                          const uint8_t *in, size_t len) {
  const EC_GROUP *group = method->group;
  CBS cbs, tmp;
  CBS_init(&cbs, in, len);
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  EC_SCALAR *scalars[] = {&key->x0, &key->y0, &key->x1,
                          &key->y1, &key->xs, &key->ys};
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(scalars); i++) {
    if (!CBS_get_bytes(&cbs, &tmp, scalar_len) ||
        !ec_scalar_from_bytes(group, scalars[i], CBS_data(&tmp),
                              CBS_len(&tmp))) {
      OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
      return 0;
    }
  }

  // Recompute the public key.
  EC_JACOBIAN pub[3];
  EC_AFFINE pub_affine[3];
  if (!ec_point_mul_scalar_precomp(group, &pub[0], &method->g_precomp, &key->x0,
                                   &method->h_precomp, &key->y0, NULL, NULL) ||
      !ec_init_precomp(group, &key->pub0_precomp, &pub[0]) ||
      !ec_point_mul_scalar_precomp(group, &pub[1], &method->g_precomp, &key->x1,
                                   &method->h_precomp, &key->y1, NULL, NULL) ||
      !ec_init_precomp(group, &key->pub1_precomp, &pub[1]) ||
      !ec_point_mul_scalar_precomp(group, &pub[2], &method->g_precomp, &key->xs,
                                   &method->h_precomp, &key->ys, NULL, NULL) ||
      !ec_init_precomp(group, &key->pubs_precomp, &pub[2]) ||
      !ec_jacobian_to_affine_batch(group, pub_affine, pub, 3)) {
    return 0;
  }

  key->pub0 = pub_affine[0];
  key->pub1 = pub_affine[1];
  key->pubs = pub_affine[2];
  return 1;
}